

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.cpp
# Opt level: O1

void __thiscall deqp::gls::ShaderPerformanceMeasurer::iterate(ShaderPerformanceMeasurer *this)

{
  TheilSenCalibrator *this_00;
  int iVar1;
  State SVar2;
  int iVar3;
  deUint32 err;
  deUint64 dVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined1 auVar6 [16];
  double dVar7;
  
  dVar4 = deGetMicroseconds();
  this_00 = &this->m_calibrator;
  render(this,(this->m_calibrator).m_measureState.numDrawCalls);
  SVar2 = TheilSenCalibrator::getState(this_00);
  if (SVar2 == STATE_MEASURE) {
    if (this->m_isFirstIteration == false) {
      TheilSenCalibrator::recordIteration(this_00,dVar4 - this->m_prevRenderStartTime);
    }
    this->m_isFirstIteration = false;
  }
  else {
    if (SVar2 != STATE_RECOMPUTE_PARAMS) {
      iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
      err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
      glu::checkError(err,"End of rendering",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderPerformanceMeasurer.cpp"
                      ,0x129);
      dVar4 = MeasureState::getTotalTime(&(this->m_calibrator).m_measureState);
      lVar5 = (long)((int)((ulong)((long)(this->m_calibrator).m_measureState.frameTimes.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_calibrator).m_measureState.frameTimes.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    (this->m_calibrator).m_measureState.numDrawCalls);
      iVar3 = this->m_viewportWidth;
      iVar1 = this->m_viewportHeight;
      auVar6._8_4_ = (int)(dVar4 >> 0x20);
      auVar6._0_8_ = dVar4;
      auVar6._12_4_ = 0x45300000;
      dVar7 = (auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)dVar4) - 4503599627370496.0);
      (this->m_result).megaVertPerSec =
           (float)((double)(((this->m_gridSizeY + 1) * (this->m_gridSizeX + 1)) * lVar5) / dVar7);
      (this->m_result).megaFragPerSec = (float)((double)((long)iVar1 * (long)iVar3 * lVar5) / dVar7)
      ;
      this->m_state = STATE_FINISHED;
      return;
    }
    TheilSenCalibrator::recomputeParameters(this_00);
    this->m_isFirstIteration = true;
  }
  this->m_prevRenderStartTime = dVar4;
  return;
}

Assistant:

void ShaderPerformanceMeasurer::iterate (void)
{
	DE_ASSERT(m_state == STATE_MEASURING);

	deUint64 renderStartTime = deGetMicroseconds();
	render(m_calibrator.getCallCount()); // Always render. This gives more stable performance behavior.

	TheilSenCalibrator::State calibratorState = m_calibrator.getState();

	if (calibratorState == TheilSenCalibrator::STATE_RECOMPUTE_PARAMS)
	{
		m_calibrator.recomputeParameters();

		m_isFirstIteration = true;
		m_prevRenderStartTime = renderStartTime;
	}
	else if (calibratorState == TheilSenCalibrator::STATE_MEASURE)
	{
		if (!m_isFirstIteration)
			m_calibrator.recordIteration(renderStartTime - m_prevRenderStartTime);

		m_isFirstIteration = false;
		m_prevRenderStartTime = renderStartTime;
	}
	else
	{
		DE_ASSERT(calibratorState == TheilSenCalibrator::STATE_FINISHED);

		GLU_EXPECT_NO_ERROR(m_renderCtx.getFunctions().getError(), "End of rendering");

		const MeasureState& measureState = m_calibrator.getMeasureState();

		// Compute result.
		deUint64	totalTime			= measureState.getTotalTime();
		int			numFrames			= (int)measureState.frameTimes.size();
		deInt64		numQuadGrids		= measureState.numDrawCalls * numFrames;
		deInt64		numPixels			= (deInt64)m_viewportWidth * (deInt64)m_viewportHeight * numQuadGrids;
		deInt64		numVertices			= (deInt64)getNumVertices(m_gridSizeX, m_gridSizeY) * numQuadGrids;
		double		mfragPerSecond		= (double)numPixels / (double)totalTime;
		double		mvertPerSecond		= (double)numVertices / (double)totalTime;

		m_result = Result((float)mvertPerSecond, (float)mfragPerSecond);
		m_state = STATE_FINISHED;
	}
}